

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O0

void SUNDlsMat_denseGETRS(sunrealtype **a,sunindextype n,sunindextype *p,sunrealtype *b)

{
  sunrealtype sVar1;
  long lVar2;
  sunrealtype *psVar3;
  sunrealtype tmp;
  sunrealtype *col_k;
  sunindextype pk;
  sunindextype k;
  sunindextype i;
  sunrealtype *b_local;
  sunindextype *p_local;
  sunindextype n_local;
  sunrealtype **a_local;
  
  for (k = 0; k < n; k = k + 1) {
    lVar2 = p[k];
    if (lVar2 != k) {
      sVar1 = b[k];
      b[k] = b[lVar2];
      b[lVar2] = sVar1;
    }
  }
  for (k = 0; k < n + -1; k = k + 1) {
    psVar3 = a[k];
    i = k;
    while (i = i + 1, i < n) {
      b[i] = -psVar3[i] * b[k] + b[i];
    }
  }
  for (k = n + -1; 0 < k; k = k + -1) {
    psVar3 = a[k];
    b[k] = b[k] / psVar3[k];
    for (i = 0; i < k; i = i + 1) {
      b[i] = -psVar3[i] * b[k] + b[i];
    }
  }
  *b = *b / **a;
  return;
}

Assistant:

void SUNDlsMat_denseGETRS(sunrealtype** a, sunindextype n, sunindextype* p,
                          sunrealtype* b)
{
  sunindextype i, k, pk;
  sunrealtype *col_k, tmp;

  /* Permute b, based on pivot information in p */
  for (k = 0; k < n; k++)
  {
    pk = p[k];
    if (pk != k)
    {
      tmp   = b[k];
      b[k]  = b[pk];
      b[pk] = tmp;
    }
  }

  /* Solve Ly = b, store solution y in b */
  for (k = 0; k < n - 1; k++)
  {
    col_k = a[k];
    for (i = k + 1; i < n; i++) { b[i] -= col_k[i] * b[k]; }
  }

  /* Solve Ux = y, store solution x in b */
  for (k = n - 1; k > 0; k--)
  {
    col_k = a[k];
    b[k] /= col_k[k];
    for (i = 0; i < k; i++) { b[i] -= col_k[i] * b[k]; }
  }
  b[0] /= a[0][0];
}